

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

void __thiscall
llvm::yaml::IO::processKey<llvm::DWARFYAML::InitialLength,llvm::yaml::EmptyContext>
          (IO *this,char *Key,InitialLength *Val,bool Required,EmptyContext *Ctx)

{
  uint uVar1;
  EmptyContext *Ctx_00;
  EmptyContext local_39;
  undefined8 uStack_38;
  bool UseDefault;
  void *SaveInfo;
  EmptyContext *Ctx_local;
  InitialLength *pIStack_20;
  bool Required_local;
  InitialLength *Val_local;
  char *Key_local;
  IO *this_local;
  
  Ctx_00 = &local_39;
  SaveInfo = Ctx;
  Ctx_local._7_1_ = Required;
  pIStack_20 = Val;
  Val_local = (InitialLength *)Key;
  Key_local = (char *)this;
  uVar1 = (*this->_vptr_IO[0xf])(this,Key,(ulong)Required,0,Ctx_00,&stack0xffffffffffffffc8);
  if ((uVar1 & 1) != 0) {
    yamlize<llvm::DWARFYAML::InitialLength,llvm::yaml::EmptyContext>
              ((yaml *)this,(IO *)pIStack_20,(InitialLength *)(ulong)(Ctx_local._7_1_ & 1),
               SUB81(SaveInfo,0),Ctx_00);
    (*this->_vptr_IO[0x10])(this,uStack_38);
  }
  return;
}

Assistant:

void processKey(const char *Key, T &Val, bool Required, Context &Ctx) {
    void *SaveInfo;
    bool UseDefault;
    if ( this->preflightKey(Key, Required, false, UseDefault, SaveInfo) ) {
      yamlize(*this, Val, Required, Ctx);
      this->postflightKey(SaveInfo);
    }
  }